

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QSize __thiscall QToolBarAreaLayoutItem::realSizeHint(QToolBarAreaLayoutItem *this)

{
  int iVar1;
  QSizePolicy QVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QSize QVar6;
  ulong uVar7;
  Representation RVar8;
  ulong uVar9;
  uint uVar10;
  Representation RVar11;
  QWidget *this_00;
  
  iVar1 = (*this->widgetItem->_vptr_QLayoutItem[0xd])();
  this_00 = (QWidget *)CONCAT44(extraout_var,iVar1);
  uVar3 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
  uVar4 = (**(code **)(*(long *)this_00 + 0x78))(this_00);
  uVar5 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar5 = uVar3;
  }
  if ((int)((ulong)uVar4 >> 0x20) < (int)((ulong)uVar3 >> 0x20)) {
    uVar4 = uVar3;
  }
  QVar2 = QWidget::sizePolicy(this_00);
  RVar8.m_i = (uint)uVar5;
  if (((uint)QVar2.field_0 & 0xf0000) == 0xd0000) {
    RVar8.m_i = 0;
  }
  QVar2 = QWidget::sizePolicy(this_00);
  uVar10 = (uint)((ulong)uVar4 >> 0x20);
  if (((uint)QVar2.field_0 & 0xf00000) == 0xd00000) {
    uVar10 = 0;
  }
  QVar6 = QWidget::maximumSize(this_00);
  if (QVar6.wd.m_i.m_i <= RVar8.m_i) {
    RVar8.m_i = QVar6.wd.m_i.m_i;
  }
  RVar11.m_i = QVar6.ht.m_i.m_i;
  if ((int)uVar10 < QVar6.ht.m_i.m_i) {
    RVar11.m_i = uVar10;
  }
  QVar6 = QWidget::minimumSize(this_00);
  uVar7 = (ulong)QVar6 >> 0x20;
  uVar9 = (ulong)(uint)RVar8.m_i;
  if (RVar8.m_i <= QVar6.wd.m_i.m_i) {
    uVar9 = (ulong)QVar6 & 0xffffffff;
  }
  if (QVar6.ht.m_i.m_i < RVar11.m_i) {
    uVar7 = (ulong)(uint)RVar11.m_i;
  }
  return (QSize)(uVar7 << 0x20 | uVar9);
}

Assistant:

QSize QToolBarAreaLayoutItem::realSizeHint() const
{
    QWidget *wid = widgetItem->widget();
    QSize s = wid->sizeHint().expandedTo(wid->minimumSizeHint());
    if (wid->sizePolicy().horizontalPolicy() == QSizePolicy::Ignored)
        s.setWidth(0);
    if (wid->sizePolicy().verticalPolicy() == QSizePolicy::Ignored)
        s.setHeight(0);
    s = s.boundedTo(wid->maximumSize())
        .expandedTo(wid->minimumSize());
    return s;
}